

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O0

int __thiscall
DIS::StandardVariableSpecification::getMarshalledSize(StandardVariableSpecification *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_80 [8];
  SimulationManagementPduHeader listElement;
  unsigned_long_long idx;
  int marshalSize;
  StandardVariableSpecification *this_local;
  
  idx._4_4_ = 2;
  listElement._recevingID._entityNumber = 0;
  listElement._recevingID._26_6_ = 0;
  while( true ) {
    uVar1 = listElement._recevingID._24_8_;
    sVar3 = std::
            vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
            ::size(&this->_standardVariables);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::
             vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
             ::operator[](&this->_standardVariables,listElement._recevingID._24_8_);
    SimulationManagementPduHeader::SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80,pvVar4);
    iVar2 = SimulationManagementPduHeader::getMarshalledSize
                      ((SimulationManagementPduHeader *)local_80);
    idx._4_4_ = idx._4_4_ + iVar2;
    SimulationManagementPduHeader::~SimulationManagementPduHeader
              ((SimulationManagementPduHeader *)local_80);
    listElement._recevingID._24_8_ = listElement._recevingID._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int StandardVariableSpecification::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 2;  // _numberOfStandardVariableRecords

   for(unsigned long long idx=0; idx < _standardVariables.size(); idx++)
   {
        SimulationManagementPduHeader listElement = _standardVariables[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}